

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

void __thiscall
slang::parsing::Token::Token
          (Token *this,BumpAllocator *alloc,TokenKind kind,
          span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia,string_view rawText,
          SourceLocation location,SVInt *value)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  SVInt *pSVar7;
  Info *pIVar8;
  ulong size;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 __dest;
  
  (this->numFlags).raw = '\0';
  this->rawLen = 0;
  this->info = (Info *)0x0;
  init(this,(EVP_PKEY_CTX *)alloc);
  uVar5 = (value->super_SVIntStorage).bitWidth;
  bVar2 = (value->super_SVIntStorage).signFlag;
  bVar3 = (value->super_SVIntStorage).unknownFlag;
  if (uVar5 < 0x41 && (bVar3 & 1U) == 0) {
    if ((bVar3 & 1U) != 0) {
      value = (SVInt *)(value->super_SVIntStorage).field_0.val;
    }
    __dest = (value->super_SVIntStorage).field_0;
  }
  else {
    size = (ulong)(((uVar5 + 0x3f >> 6) << (bVar3 & 0x1fU)) << 3);
    __dest.val = (ulong)(alloc->head->current + 7) & 0xfffffffffffffff8;
    pbVar1 = (byte *)(__dest.val + size);
    if (alloc->endPtr < pbVar1) {
      __dest.pVal = (uint64_t *)BumpAllocator::allocateSlow(alloc,size,8);
    }
    else {
      alloc->head->current = pbVar1;
    }
    uVar6 = (value->super_SVIntStorage).bitWidth;
    bVar4 = (value->super_SVIntStorage).unknownFlag;
    pSVar7 = (SVInt *)(value->super_SVIntStorage).field_0.pVal;
    if ((bVar4 & 1U) != 0) {
      value = pSVar7;
    }
    if (0x40 < uVar6) {
      value = pSVar7;
    }
    memcpy(__dest.pVal,value,(ulong)(((uVar6 + 0x3f >> 6) << (bVar4 & 0x1fU)) << 3));
  }
  pIVar8 = this->info;
  pIVar8[1].rawTextPtr = (char *)__dest;
  *(uint *)&pIVar8[1].location = uVar5;
  pIVar8[1].location.field_0x4 = bVar2;
  pIVar8[1].location.field_0x5 = bVar3;
  return;
}

Assistant:

Token::Token(BumpAllocator& alloc, TokenKind kind, std::span<Trivia const> trivia,
             std::string_view rawText, SourceLocation location, const SVInt& value) {
    SLANG_ASSERT(kind == TokenKind::IntegerLiteral);
    init(alloc, kind, trivia, rawText, location);

    SVIntStorage storage(value.getBitWidth(), value.isSigned(), value.hasUnknown());
    if (value.isSingleWord())
        storage.val = *value.getRawPtr();
    else {
        storage.pVal = (uint64_t*)alloc.allocate(sizeof(uint64_t) * value.getNumWords(),
                                                 alignof(uint64_t));
        memcpy(storage.pVal, value.getRawPtr(), sizeof(uint64_t) * value.getNumWords());
    }

    info->integer() = storage;
}